

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O0

void deqp::gles3::Functional::DepthStencilCaseUtil::render
               (vector<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
                *clears,int viewportX,int viewportY)

{
  size_type sVar1;
  const_reference pvVar2;
  float red;
  float green;
  float blue;
  float alpha;
  ClearCommand *clear;
  int ndx;
  int viewportY_local;
  int viewportX_local;
  vector<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
  *clears_local;
  
  glwEnable(0xc11);
  clear._4_4_ = 0;
  while( true ) {
    sVar1 = std::
            vector<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
            ::size(clears);
    if ((int)sVar1 <= clear._4_4_) break;
    pvVar2 = std::
             vector<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand,_std::allocator<deqp::gles3::Functional::DepthStencilCaseUtil::ClearCommand>_>
             ::operator[](clears,(long)clear._4_4_);
    if ((pvVar2->buffers & 0x4000) != 0) {
      red = tcu::Vector<float,_4>::x(&pvVar2->color);
      green = tcu::Vector<float,_4>::y(&pvVar2->color);
      blue = tcu::Vector<float,_4>::z(&pvVar2->color);
      alpha = tcu::Vector<float,_4>::w(&pvVar2->color);
      glwClearColor(red,green,blue,alpha);
    }
    if ((pvVar2->buffers & 0x400) != 0) {
      glwClearStencil(pvVar2->stencil);
    }
    glwScissor((pvVar2->rect).left + viewportX,(pvVar2->rect).bottom + viewportY,
               (pvVar2->rect).width,(pvVar2->rect).height);
    glwClear(pvVar2->buffers);
    clear._4_4_ = clear._4_4_ + 1;
  }
  glwDisable(0xc11);
  return;
}

Assistant:

void render (const vector<ClearCommand>& clears, int viewportX, int viewportY)
{
	glEnable(GL_SCISSOR_TEST);

	for (int ndx = 0; ndx < (int)clears.size(); ndx++)
	{
		const ClearCommand& clear = clears[ndx];

		if (clear.buffers & GL_COLOR_BUFFER_BIT)	glClearColor(clear.color.x(), clear.color.y(), clear.color.z(), clear.color.w());
		if (clear.buffers & GL_STENCIL_BUFFER_BIT)	glClearStencil(clear.stencil);

		DE_ASSERT(clear.buffers == (clear.buffers & (GL_COLOR_BUFFER_BIT|GL_STENCIL_BUFFER_BIT))); // \note Don't use clear for depths.

		glScissor(clear.rect.left+viewportX, clear.rect.bottom+viewportY, clear.rect.width, clear.rect.height);
		glClear(clear.buffers);
	}

	glDisable(GL_SCISSOR_TEST);
}